

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsim.cpp
# Opt level: O1

int32_t parse_frame(int64_t k)

{
  Btor2Line *pBVar1;
  uint uVar2;
  pointer pBVar3;
  int64_t iVar4;
  int32_t iVar5;
  uint uVar6;
  int64_t iVar7;
  pointer pBVar8;
  char *pcVar9;
  size_t sVar10;
  long lVar11;
  long lVar12;
  anon_union_8_2_8be7de1a_for_BtorSimState_2 index;
  BtorSimBitVector *pBVar13;
  anon_union_8_2_8be7de1a_for_BtorSimState_2 b;
  BtorSimBitVector *pBVar14;
  BtorSimArrayModel *pBVar15;
  ulong extraout_RAX;
  char *pcVar16;
  anon_union_8_2_8be7de1a_for_BtorSimState_2 this;
  char cVar17;
  ulong unaff_RBX;
  Btor2Line *unaff_RBP;
  anon_union_8_2_8be7de1a_for_BtorSimState_2 aVar18;
  char *m;
  char *pcVar19;
  pointer unaff_R12;
  pointer unaff_R14;
  ulong uVar20;
  BtorSimState BVar21;
  int32_t ch;
  BtorSimState tmp;
  int local_4c;
  BtorSimState local_48;
  int64_t local_38;
  
  if (0 < k) {
    transition(k);
  }
  msg(2,"parsing frame %ld",k);
  local_4c = next_char();
  if (local_4c == 0x23) {
    iVar7 = parse_unsigned_number(&local_4c);
    if ((iVar7 != k) || (local_4c != 10)) {
LAB_00111db4:
      pcVar19 = "missing \'#%ld\' state part header of frame %ld";
      pBVar8 = (pointer)k;
      goto LAB_00111dc1;
    }
    pBVar8 = (pointer)parse_assignment();
    iVar4 = charno;
    iVar7 = local_38;
    while (local_38 = iVar4, charno = local_38, -1 < (long)pBVar8) {
      charno = 1;
      lineno = lineno + -1;
      if ((long)states.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)states.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
                super__Vector_impl_data._M_start >> 3 <= (long)pBVar8) {
        pcVar19 = "less than %ld states defined";
        unaff_R14 = pBVar8;
        local_38 = iVar7;
        goto LAB_00111d79;
      }
      unaff_RBP = states.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
                  super__Vector_impl_data._M_start[(long)pBVar8];
      if ((unaff_RBP->sort).tag == BTOR2_TAG_SORT_bitvec) {
        if (_ZL6symbol_1 == _ZL6symbol_0) {
          msg(4,"state assignment \'%ld %s\' at time frame %ld",pBVar8,_ZL8constant_0,k);
        }
        else {
          msg(4,"state assignment \'%ld %s %s\' at time frame %ld",pBVar8,_ZL8constant_0,
              _ZL6symbol_0,k);
        }
        sVar10 = strlen(_ZL8constant_0);
        if (sVar10 != (unaff_RBP->sort).field_3.bitvec.width) goto LAB_00111d0e;
        unaff_RBX = 0;
      }
      else {
        pcVar19 = _ZL11array_index_1 + -(long)_ZL11array_index_0;
        if (pcVar19 == (char *)0x0) {
          if (_ZL11array_index_1 == _ZL11array_index_2) {
            sVar10 = ((long)_ZL11array_index_2 - (long)_ZL11array_index_0) * 2;
            if (_ZL11array_index_2 == _ZL11array_index_0) {
              sVar10 = 1;
            }
            pcVar19 = (char *)realloc(_ZL11array_index_0,sVar10);
            if (pcVar19 != (char *)0x0) {
              _ZL11array_index_2 = pcVar19 + sVar10;
              _ZL11array_index_0 = pcVar19;
              _ZL11array_index_1 = pcVar19;
              goto LAB_00111634;
            }
LAB_00111daf:
            parse_frame();
            goto LAB_00111db4;
          }
LAB_00111634:
          pcVar19 = _ZL11array_index_1 + 1;
          pcVar16 = pcVar19;
          *_ZL11array_index_1 = '*';
          _ZL11array_index_1 = pcVar16;
          pcVar16 = _ZL11array_index_0;
          if (pcVar19 == _ZL11array_index_2) {
            sVar10 = ((long)_ZL11array_index_2 - (long)_ZL11array_index_0) * 2;
            if (_ZL11array_index_2 == _ZL11array_index_0) {
              sVar10 = 1;
            }
            pcVar9 = (char *)realloc(_ZL11array_index_0,sVar10);
            if (pcVar9 == (char *)0x0) {
              parse_frame();
              goto LAB_00111daf;
            }
            pcVar19 = pcVar9 + ((long)pcVar19 - (long)pcVar16);
            _ZL11array_index_2 = pcVar9 + sVar10;
            _ZL11array_index_0 = pcVar9;
            _ZL11array_index_1 = pcVar19;
          }
          pcVar16 = _ZL11array_index_1 + 1;
          *_ZL11array_index_1 = '\0';
          _ZL11array_index_1 = pcVar16;
        }
        if (_ZL6symbol_1 == _ZL6symbol_0) {
          pcVar9 = "state assignment \'%ld [%s] %s\' at time frame %ld";
          pcVar16 = (char *)k;
        }
        else {
          pcVar9 = "state assignment \'%ld [%s] %s %s\' at time frame %ld";
          pcVar16 = _ZL6symbol_0;
        }
        msg(4,pcVar9,pBVar8,_ZL11array_index_0,_ZL8constant_0,pcVar16);
        lVar11 = btor2parser_get_line_by_id(model,(unaff_RBP->sort).field_3.array.index);
        lVar12 = btor2parser_get_line_by_id(model,(unaff_RBP->sort).field_3.array.element);
        if ((long)_ZL11array_index_1 - (long)_ZL11array_index_0 == 2) {
          unaff_RBX = CONCAT71((int7)((ulong)pcVar19 >> 8),*_ZL11array_index_0 == '*');
        }
        else {
          unaff_RBX = 0;
        }
        sVar10 = strlen(_ZL11array_index_0);
        if (sVar10 != *(uint *)(lVar11 + 0x38) && (unaff_RBX & 1) == 0) {
          charno = index_columno;
          pcVar19 = "expected index of width \'%u\'";
          unaff_R14 = (pointer)(unaff_RBP->sort).field_3.array.index;
          goto LAB_00111d79;
        }
        sVar10 = strlen(_ZL8constant_0);
        pBVar3 = current_state.super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (sVar10 != *(uint *)(lVar12 + 0x38)) {
          charno = constant_columno;
          pcVar19 = "expected element of width \'%u\'";
          unaff_R14 = (pointer)(unaff_RBP->sort).field_3.array.element;
          goto LAB_00111d79;
        }
        if (current_state.super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>._M_impl.
            super__Vector_impl_data._M_start[unaff_RBP->id].field_1.bv_state ==
            (BtorSimBitVector *)0x0) {
          pBVar15 = (BtorSimArrayModel *)operator_new(0x58);
          uVar6 = *(uint *)(lVar12 + 0x38);
          pBVar15->index_width = (ulong)*(uint *)(lVar11 + 0x38);
          pBVar15->element_width = (ulong)uVar6;
          pBVar15->random_seed = 0;
          pBVar15->const_init = (BtorSimBitVector *)0x0;
          (pBVar15->data)._M_h._M_buckets = &(pBVar15->data)._M_h._M_single_bucket;
          (pBVar15->data)._M_h._M_bucket_count = 1;
          (pBVar15->data)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          (pBVar15->data)._M_h._M_element_count = 0;
          (pBVar15->data)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
          (pBVar15->data)._M_h._M_rehash_policy._M_next_resize = 0;
          (pBVar15->data)._M_h._M_single_bucket = (__node_base_ptr)0x0;
          pBVar3[unaff_RBP->id].field_1.array_state = pBVar15;
        }
      }
      cVar17 = (char)unaff_RBX;
      if ((unaff_RBP->sort).tag == BTOR2_TAG_SORT_array && (unaff_RBX & 1) == 0) {
        index.bv_state = btorsim_bv_char_to_bv(_ZL11array_index_0);
      }
      else {
        index.bv_state = (BtorSimBitVector *)0x0;
      }
      pBVar13 = btorsim_bv_char_to_bv(_ZL8constant_0);
      if (k == 0) {
        pBVar1 = inits.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
                 super__Vector_impl_data._M_start[unaff_RBP->id];
        if ((pBVar1 != (Btor2Line *)0x0) &&
           (nexts.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
            super__Vector_impl_data._M_start[unaff_RBP->id] != (Btor2Line *)0x0)) {
          pcVar19 = "init & next for state %ld";
          msg(4,"init & next for state %ld");
          BVar21 = simulate(pBVar1->args[1]);
          this = BVar21.field_1;
          local_48.type = BVar21.type;
          local_48.field_1 = this;
          if ((unaff_RBP->sort).tag == BTOR2_TAG_SORT_bitvec) {
            iVar5 = btorsim_bv_compare(pBVar13,this.bv_state);
            if (iVar5 != 0) goto LAB_00111d9a;
          }
          else {
            if (cVar17 == '\0') {
              aVar18 = index;
              b.bv_state = BtorSimArrayModel::check(this.array_state,index.bv_state);
              this = aVar18;
            }
            else {
              b.bv_state = btorsim_bv_copy(this.bv_state);
              this = (anon_union_8_2_8be7de1a_for_BtorSimState_2)pcVar19;
            }
            if ((BtorSimArrayModel *)b.bv_state != (BtorSimArrayModel *)0x0) {
              this = b;
              iVar5 = btorsim_bv_compare(pBVar13,b.bv_state);
              if (iVar5 != 0) goto LAB_00111d9a;
              btorsim_bv_free(b.bv_state);
            }
          }
          BtorSimState::remove(&local_48,(char *)this.bv_state);
        }
      }
      lineno = lineno + 1;
      charno = local_38;
      if ((0 < k) &&
         (nexts.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
          super__Vector_impl_data._M_start[unaff_RBP->id] != (Btor2Line *)0x0)) {
        pBVar15 = current_state.super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>.
                  _M_impl.super__Vector_impl_data._M_start[unaff_RBP->id].field_1.array_state;
        if ((unaff_RBP->sort).tag == BTOR2_TAG_SORT_bitvec) {
          iVar5 = btorsim_bv_compare(pBVar13,(BtorSimBitVector *)pBVar15);
          unaff_R14 = pBVar8;
          if (iVar5 != 0) goto LAB_00111d80;
        }
        else {
          if (cVar17 == '\0') {
            pBVar14 = BtorSimArrayModel::check(pBVar15,index.bv_state);
          }
          else {
            pBVar14 = BtorSimArrayModel::get_const_init(pBVar15);
          }
          if (pBVar14 != (BtorSimBitVector *)0x0) {
            iVar5 = btorsim_bv_compare(pBVar13,pBVar14);
            unaff_R14 = pBVar8;
            if (iVar5 != 0) goto LAB_00111d80;
            btorsim_bv_free(pBVar14);
          }
        }
      }
      if ((unaff_RBP->sort).tag == BTOR2_TAG_SORT_bitvec) {
        lVar11 = unaff_RBP->id;
        msg(5,"updating state %ld",lVar11);
        unaff_R14 = current_state.super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>.
                    _M_impl.super__Vector_impl_data._M_start + lVar11;
        BtorSimState::update(unaff_R14,pBVar13);
      }
      else {
        local_48.field_1.bv_state = (BtorSimBitVector *)0x0;
        local_48.type = ARRAY;
        if (cVar17 == '\0') {
          local_48.field_1 =
               (anon_union_8_2_8be7de1a_for_BtorSimState_2)
               BtorSimArrayModel::write
                         (current_state.
                          super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>._M_impl.
                          super__Vector_impl_data._M_start[unaff_RBP->id].field_1.array_state,
                          index._0_4_,pBVar13,
                          (size_t)current_state.
                                  super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          btorsim_bv_free(index.bv_state);
        }
        else {
          local_48.field_1.array_state =
               BtorSimArrayModel::set_const_init
                         (current_state.
                          super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>._M_impl.
                          super__Vector_impl_data._M_start[unaff_RBP->id].field_1.array_state,
                          pBVar13);
        }
        lVar11 = unaff_RBP->id;
        msg(5,"updating state %ld",lVar11);
        unaff_R14 = current_state.super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>.
                    _M_impl.super__Vector_impl_data._M_start + lVar11;
        BtorSimState::update(unaff_R14,&local_48);
        btorsim_bv_free(pBVar13);
      }
      pBVar8 = (pointer)parse_assignment();
      unaff_R12 = pBVar8;
      iVar4 = charno;
      iVar7 = local_38;
    }
  }
  else {
    prev_char(local_4c);
    iVar7 = local_38;
  }
  local_38 = iVar7;
  local_48.type = next_char();
  if (((local_48.type != 0x40) || (iVar7 = parse_unsigned_number((int32_t *)&local_48), iVar7 != k))
     || (local_48.type != 10)) {
    parse_assignment();
  }
  unaff_R14 = (pointer)parse_assignment();
  pBVar8 = unaff_R12;
  iVar4 = charno;
  iVar7 = local_38;
joined_r0x00111abd:
  local_38 = iVar4;
  if ((long)unaff_R14 < 0) {
    charno = local_38;
    if (k == 0) {
      local_38 = iVar7;
      initialize_states(0);
      iVar7 = local_38;
    }
    local_38 = iVar7;
    initialize_inputs(k,0);
    simulate_step(k,0);
    return found_end_of_witness ^ 1;
  }
  charno = 1;
  lineno = lineno + -1;
  if ((long)inputs.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)inputs.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
            super__Vector_impl_data._M_start >> 3 <= (long)unaff_R14) {
    pcVar19 = "less than %ld defined";
    local_38 = iVar7;
LAB_00111d79:
    parse_error(pcVar19,unaff_R14);
    unaff_R14 = pBVar8;
LAB_00111d80:
    unaff_RBX = unaff_RBP->id;
    pcVar19 = "incompatible assignment for state %ld id %ld in time frame %ld";
    pBVar8 = unaff_R14;
    goto LAB_00111d8e;
  }
  pcVar19 = (char *)k;
  if (_ZL11array_index_1 == _ZL11array_index_0) {
    if (_ZL6symbol_1 != _ZL6symbol_0) {
      m = "input assignment \'%ld %s %s\' at time frame %ld";
      pcVar16 = _ZL8constant_0;
      pcVar9 = _ZL6symbol_0;
      goto LAB_00111b70;
    }
    msg(4,"input assignment \'%ld %s\' at time frame %ld",unaff_R14,_ZL8constant_0,k);
  }
  else {
    pcVar16 = _ZL11array_index_0;
    pcVar9 = _ZL8constant_0;
    if (_ZL6symbol_1 == _ZL6symbol_0) {
      m = "input assignment \'%ld [%s] %s\' at time frame %ld";
    }
    else {
      m = "input assignment \'%ld [%s] %s %s\' at time frame %ld";
      pcVar19 = _ZL6symbol_0;
    }
LAB_00111b70:
    msg(4,m,unaff_R14,pcVar16,pcVar9,pcVar19);
  }
  pcVar19 = _ZL8constant_0;
  pBVar8 = current_state.super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>._M_impl.
           super__Vector_impl_data._M_start;
  unaff_RBP = inputs.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
              super__Vector_impl_data._M_start[(long)unaff_R14];
  unaff_RBX = unaff_RBP->id;
  if (current_state.super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>._M_impl.
      super__Vector_impl_data._M_start[unaff_RBX].type != BITVEC) {
    pBVar13 = btorsim_bv_char_to_bv(_ZL11array_index_0);
    pBVar14 = btorsim_bv_char_to_bv(_ZL8constant_0);
    lineno = lineno + 1;
    charno = local_38;
    pBVar15 = (BtorSimArrayModel *)
              BtorSimArrayModel::write
                        (current_state.
                         super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>._M_impl.
                         super__Vector_impl_data._M_start[unaff_RBP->id].field_1.array_state,
                         (int)pBVar13,pBVar14,unaff_RBP->id * 0x10);
    lVar11 = unaff_RBP->id;
    msg(5,"updating state %ld",lVar11);
    BtorSimState::update
              (current_state.super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>._M_impl
               .super__Vector_impl_data._M_start + lVar11,pBVar15);
LAB_00111c9a:
    unaff_R14 = (pointer)parse_assignment();
    iVar4 = charno;
    iVar7 = local_38;
    goto joined_r0x00111abd;
  }
  sVar10 = strlen(_ZL8constant_0);
  if (sVar10 == (unaff_RBP->sort).field_3.bitvec.width) {
    if (pBVar8[unaff_RBX].field_1.bv_state == (BtorSimBitVector *)0x0) {
      pBVar13 = btorsim_bv_char_to_bv(pcVar19);
      lineno = lineno + 1;
      charno = local_38;
      lVar11 = unaff_RBP->id;
      msg(5,"updating state %ld",lVar11);
      BtorSimState::update
                (current_state.super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>.
                 _M_impl.super__Vector_impl_data._M_start + lVar11,pBVar13);
      goto LAB_00111c9a;
    }
  }
  else {
LAB_00111d0e:
    charno = constant_columno;
    parse_error("expected constant of width \'%u\'");
  }
  pcVar19 = "input %ld id %ld assigned twice in frame %ld";
LAB_00111d8e:
  parse_error(pcVar19,unaff_R14,unaff_RBX,k);
LAB_00111d9a:
  k = unaff_RBP->id;
  pcVar19 = "incompatible initialized state %ld id %ld";
LAB_00111dc1:
  parse_error(pcVar19,pBVar8,k);
  iVar5 = next_char();
  if (iVar5 == 0x30) {
    uVar6 = next_char();
    uVar20 = (ulong)uVar6;
    if (uVar6 - 0x30 < 10) {
      do {
        parse_error("unexpected digit \'%c\' after \'0\'",uVar20 & 0xffffffff);
LAB_00111e86:
        pcVar19 = "expected digit";
LAB_00111e6f:
        parse_error(pcVar19);
        uVar20 = extraout_RAX;
      } while( true );
    }
    uVar20 = 0;
  }
  else {
    if (9 < iVar5 - 0x30U) goto LAB_00111e86;
    uVar20 = (ulong)(iVar5 - 0x30U);
    uVar6 = next_char();
    while (uVar2 = uVar6 - 0x30, uVar2 < 10) {
      if (0xccccccccccccccc < (long)uVar20) {
        pcVar19 = "number too large (too many digits)";
        goto LAB_00111e6f;
      }
      if ((long)((ulong)uVar2 ^ 0x7fffffffffffffff) < (long)(uVar20 * 10)) {
        pcVar19 = "number too large";
        goto LAB_00111e6f;
      }
      uVar20 = uVar20 * 10 + (ulong)uVar2;
      uVar6 = next_char();
    }
  }
  *(uint *)pcVar19 = uVar6;
  return (int32_t)uVar20;
}

Assistant:

static int32_t
parse_frame (int64_t k)
{
  if (k > 0) transition (k);
  msg (2, "parsing frame %" PRId64, k);
  parse_state_part (k);
  parse_input_part (k);
  const int32_t randomize = 0;
  if (!k) initialize_states (randomize);
  initialize_inputs (k, randomize);
  simulate_step (k, randomize);
  return !found_end_of_witness;
}